

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XCoreDisassembler.c
# Opt level: O2

DecodeStatus Decode2RUSBitpInstruction(MCInst *Inst,uint Insn,uint64_t Address,void *Decoder)

{
  DecodeStatus DVar1;
  uint *Op3_00;
  uint64_t Address_00;
  uint Op3;
  uint Op2;
  uint Op1;
  uint local_24;
  uint local_20;
  uint local_1c;
  
  Op3_00 = &local_24;
  DVar1 = Decode3OpInstruction(Insn,&local_1c,&local_20,Op3_00);
  if (DVar1 == MCDisassembler_Success) {
    DecodeGRRegsRegisterClass(Inst,local_1c,Address,Op3_00);
    DecodeGRRegsRegisterClass(Inst,local_20,Address,Op3_00);
    DecodeBitpOperand(Inst,local_24,Address_00,Op3_00);
  }
  return DVar1;
}

Assistant:

static DecodeStatus Decode2RUSBitpInstruction(MCInst *Inst, unsigned Insn, uint64_t Address,
		const void *Decoder)
{
	unsigned Op1, Op2, Op3;
	DecodeStatus S = Decode3OpInstruction(Insn, &Op1, &Op2, &Op3);
	if (S == MCDisassembler_Success) {
		DecodeGRRegsRegisterClass(Inst, Op1, Address, Decoder);
		DecodeGRRegsRegisterClass(Inst, Op2, Address, Decoder);
		DecodeBitpOperand(Inst, Op3, Address, Decoder);
	}

	return S;
}